

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndGroup(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImVec2 rhs;
  float fVar4;
  byte local_5a;
  bool group_contains_prev_active_id;
  ImVec2 IStack_48;
  bool group_contains_curr_active_id;
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 local_30 [8];
  ImRect group_bb;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  pIVar3 = GetCurrentWindow();
  bVar2 = ImVector<ImGuiGroupData>::empty(&(pIVar3->DC).GroupStack);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    rhs = (ImVec2)ImVector<ImGuiGroupData>::back(&(pIVar3->DC).GroupStack);
    group_bb.Max = rhs;
    local_38 = ImMax(&(pIVar3->DC).CursorMaxPos,(ImVec2 *)rhs);
    ImRect::ImRect((ImRect *)local_30,(ImVec2 *)rhs,&local_38);
    (pIVar3->DC).CursorPos = *(ImVec2 *)group_bb.Max;
    local_40 = ImMax((ImVec2 *)((long)group_bb.Max + 8),&(pIVar3->DC).CursorMaxPos);
    (pIVar3->DC).CursorMaxPos = local_40;
    (pIVar3->DC).Indent.x = *(float *)((long)group_bb.Max + 0x10);
    (pIVar3->DC).GroupOffset.x = *(float *)((long)group_bb.Max + 0x14);
    (pIVar3->DC).CurrLineSize = *(ImVec2 *)((long)group_bb.Max + 0x18);
    (pIVar3->DC).CurrLineTextBaseOffset = *(float *)((long)group_bb.Max + 0x20);
    if ((pIVar1->LogEnabled & 1U) != 0) {
      pIVar1->LogLinePosY = -3.4028235e+38;
    }
    if ((*(byte *)((long)group_bb.Max + 0x29) & 1) == 0) {
      ImVector<ImGuiGroupData>::pop_back(&(pIVar3->DC).GroupStack);
    }
    else {
      fVar4 = ImMax<float>((pIVar3->DC).PrevLineTextBaseOffset,*(float *)((long)group_bb.Max + 0x20)
                          );
      (pIVar3->DC).CurrLineTextBaseOffset = fVar4;
      IStack_48 = ImRect::GetSize((ImRect *)local_30);
      ItemSize(&stack0xffffffffffffffb8,0.0);
      ItemAdd((ImRect *)local_30,0,(ImRect *)0x0);
      bVar2 = false;
      if ((*(ImGuiID *)((long)group_bb.Max + 0x24) != pIVar1->ActiveId) &&
         (bVar2 = false, pIVar1->ActiveIdIsAlive == pIVar1->ActiveId)) {
        bVar2 = pIVar1->ActiveId != 0;
      }
      local_5a = 0;
      if ((*(byte *)((long)group_bb.Max + 0x28) & 1) == 0) {
        local_5a = pIVar1->ActiveIdPreviousFrameIsAlive;
      }
      if (bVar2) {
        (pIVar3->DC).LastItemId = pIVar1->ActiveId;
      }
      else if ((local_5a & 1) != 0) {
        (pIVar3->DC).LastItemId = pIVar1->ActiveIdPreviousFrame;
      }
      (pIVar3->DC).LastItemRect.Min.x = (float)local_30._0_4_;
      (pIVar3->DC).LastItemRect.Min.y = (float)local_30._4_4_;
      (pIVar3->DC).LastItemRect.Max = group_bb.Min;
      if ((bVar2) && ((pIVar1->ActiveIdHasBeenEditedThisFrame & 1U) != 0)) {
        (pIVar3->DC).LastItemStatusFlags = (pIVar3->DC).LastItemStatusFlags | 4;
      }
      (pIVar3->DC).LastItemStatusFlags = (pIVar3->DC).LastItemStatusFlags | 0x10;
      if (((local_5a & 1) != 0) && (pIVar1->ActiveId != pIVar1->ActiveIdPreviousFrame)) {
        (pIVar3->DC).LastItemStatusFlags = (pIVar3->DC).LastItemStatusFlags | 0x20;
      }
      ImVector<ImGuiGroupData>::pop_back(&(pIVar3->DC).GroupStack);
    }
    return;
  }
  __assert_fail("!window->DC.GroupStack.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                ,0x1aee,"void ImGui::EndGroup()");
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(!window->DC.GroupStack.empty());  // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce Log carriage return

    if (!group_data.EmitItem)
    {
        window->DC.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize(), 0.0f);
    ItemAdd(group_bb, 0);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The tests not symmetrical because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = !group_data.BackupActiveIdPreviousFrameIsAlive && g.ActiveIdPreviousFrameIsAlive;
    if (group_contains_curr_active_id)
        window->DC.LastItemId = g.ActiveId;
    else if (group_contains_prev_active_id)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Deactivated;

    window->DC.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}